

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int __thiscall Fl_Type::remove(Fl_Type *this,char *__filename)

{
  Fl_Type *pFVar1;
  Fl_Type *r;
  Fl_Type *end;
  Fl_Type *this_local;
  
  r = this;
  while ((r->next != (Fl_Type *)0x0 && (this->level < r->next->level))) {
    r = r->next;
  }
  if (this->prev == (Fl_Type *)0x0) {
    first = r->next;
  }
  else {
    this->prev->next = r->next;
  }
  if (r->next == (Fl_Type *)0x0) {
    last = this->prev;
  }
  else {
    r->next->prev = this->prev;
  }
  pFVar1 = r->next;
  r->next = (Fl_Type *)0x0;
  this->prev = (Fl_Type *)0x0;
  if (this->parent != (Fl_Type *)0x0) {
    (*this->parent->_vptr_Fl_Type[10])();
  }
  this->parent = (Fl_Type *)0x0;
  Fl_Widget::redraw((Fl_Widget *)widget_browser);
  selection_changed((Fl_Type *)0x0);
  return (int)pFVar1;
}

Assistant:

Fl_Type *Fl_Type::remove() {
  Fl_Type *end = this;
  for (;;) {
    if (!end->next || end->next->level <= level) break;
    end = end->next;
  }
  if (prev) prev->next = end->next;
  else first = end->next;
  if (end->next) end->next->prev = prev;
  else last = prev;
  Fl_Type *r = end->next;
  prev = end->next = 0;
  if (parent) parent->remove_child(this);
  parent = 0;
  widget_browser->redraw();
  selection_changed(0);
  return r;
}